

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O1

string * stage_to_string_abi_cxx11_(string *__return_storage_ptr__,VkShaderStageFlagBits stage)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((int)stage < 0x80) {
    if ((int)stage < 0x10) {
      switch(stage) {
      case VK_SHADER_STAGE_VERTEX_BIT:
        pcVar2 = "vert";
        pcVar1 = "";
        break;
      case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
        pcVar2 = "tesc";
        pcVar1 = "";
        break;
      default:
        goto switchD_00139f28_caseD_3;
      case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
        pcVar2 = "tese";
        pcVar1 = "";
        break;
      case VK_SHADER_STAGE_GEOMETRY_BIT:
        pcVar2 = "geom";
        pcVar1 = "";
      }
      goto LAB_0013a0a9;
    }
    if (stage == VK_SHADER_STAGE_FRAGMENT_BIT) {
      pcVar2 = "frag";
      pcVar1 = "";
      goto LAB_0013a0a9;
    }
    if (stage == VK_SHADER_STAGE_COMPUTE_BIT) {
      pcVar2 = "comp";
      pcVar1 = "";
      goto LAB_0013a0a9;
    }
    if (stage == VK_SHADER_STAGE_TASK_BIT_EXT) {
      pcVar2 = "task";
      pcVar1 = "";
      goto LAB_0013a0a9;
    }
  }
  else if ((int)stage < 0x400) {
    if (stage == VK_SHADER_STAGE_MESH_BIT_EXT) {
      pcVar2 = "mesh";
      pcVar1 = "";
      goto LAB_0013a0a9;
    }
    if (stage == VK_SHADER_STAGE_RAYGEN_BIT_KHR) {
      pcVar2 = "rgen";
      pcVar1 = "";
      goto LAB_0013a0a9;
    }
    if (stage == VK_SHADER_STAGE_ANY_HIT_BIT_KHR) {
      pcVar2 = "rahit";
      pcVar1 = "";
      goto LAB_0013a0a9;
    }
  }
  else if ((int)stage < 0x1000) {
    if (stage == VK_SHADER_STAGE_CLOSEST_HIT_BIT_KHR) {
      pcVar2 = "rchit";
      pcVar1 = "";
      goto LAB_0013a0a9;
    }
    if (stage == VK_SHADER_STAGE_MISS_BIT_KHR) {
      pcVar2 = "rmiss";
      pcVar1 = "";
      goto LAB_0013a0a9;
    }
  }
  else {
    if (stage == VK_SHADER_STAGE_INTERSECTION_BIT_KHR) {
      pcVar2 = "rint";
      pcVar1 = "";
      goto LAB_0013a0a9;
    }
    if (stage == VK_SHADER_STAGE_CALLABLE_BIT_KHR) {
      pcVar2 = "rcall";
      pcVar1 = "";
      goto LAB_0013a0a9;
    }
  }
switchD_00139f28_caseD_3:
  pcVar2 = "????";
  pcVar1 = "";
LAB_0013a0a9:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

static string stage_to_string(VkShaderStageFlagBits stage)
{
	switch (stage)
	{
	case VK_SHADER_STAGE_VERTEX_BIT:
		return "vert";
	case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
		return "tesc";
	case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
		return "tese";
	case VK_SHADER_STAGE_GEOMETRY_BIT:
		return "geom";
	case VK_SHADER_STAGE_FRAGMENT_BIT:
		return "frag";
	case VK_SHADER_STAGE_COMPUTE_BIT:
		return "comp";
	case VK_SHADER_STAGE_RAYGEN_BIT_KHR:
		return "rgen";
	case VK_SHADER_STAGE_INTERSECTION_BIT_KHR:
		return "rint";
	case VK_SHADER_STAGE_MISS_BIT_KHR:
		return "rmiss";
	case VK_SHADER_STAGE_ANY_HIT_BIT_KHR:
		return "rahit";
	case VK_SHADER_STAGE_CLOSEST_HIT_BIT_KHR:
		return "rchit";
	case VK_SHADER_STAGE_CALLABLE_BIT_KHR:
		return "rcall";
	case VK_SHADER_STAGE_TASK_BIT_EXT:
		return "task";
	case VK_SHADER_STAGE_MESH_BIT_EXT:
		return "mesh";
	default:
		return "????";
	}
}